

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O3

void __thiscall
JetHead::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~vector(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this)

{
  if (this->mData != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    clear(this);
    if (this->mData != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete__(this->mData);
    }
    this->mData = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  return;
}

Assistant:

~vector()
		{
			if (mData)
			{
				// Call all of our destructors for contained objects
				clear();
				
				// Free memory
				delete[] (uint8_t*)mData;
				mData = NULL;
			}
		}